

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O1

void __thiscall
OpenMD::SectionParserManager::insert(SectionParserManager *this,SectionParser *sp,int priority)

{
  SectionParserContextList *pSVar1;
  size_t *psVar2;
  int iVar3;
  iterator iVar4;
  ostream *poVar5;
  _List_node_base *p_Var6;
  
  iVar4 = findSectionParser(this,&sp->sectionName_);
  pSVar1 = &this->sectionParsers_;
  if (iVar4._M_node != (_List_node_base *)pSVar1) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(sp->sectionName_)._M_dataplus._M_p,
                        (sp->sectionName_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," section parser already exists",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  p_Var6 = (pSVar1->
           super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var6 == (_List_node_base *)pSVar1) {
    p_Var6 = (_List_node_base *)operator_new(0x40);
    *(int *)&p_Var6[1]._M_next = priority;
    p_Var6[1]._M_prev = (_List_node_base *)sp;
    *(undefined4 *)&p_Var6[2]._M_next = 0;
    p_Var6[2]._M_prev = (_List_node_base *)0x0;
    p_Var6[3]._M_next = (_List_node_base *)0x0;
    *(undefined1 *)&p_Var6[3]._M_prev = 0;
LAB_001a0ac6:
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar2 = &(this->sectionParsers_).
              super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
  }
  else {
    do {
      iVar3 = *(int *)&p_Var6[1]._M_next;
      if (iVar3 == priority) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Priority ",9);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,priority);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," already used",0xd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        return;
      }
      if (iVar3 != priority && priority <= iVar3) {
        p_Var6 = (_List_node_base *)operator_new(0x40);
        *(int *)&p_Var6[1]._M_next = priority;
        p_Var6[1]._M_prev = (_List_node_base *)sp;
        *(undefined4 *)&p_Var6[2]._M_next = 0;
        p_Var6[2]._M_prev = (_List_node_base *)0x0;
        p_Var6[3]._M_next = (_List_node_base *)0x0;
        *(undefined1 *)&p_Var6[3]._M_prev = 0;
        goto LAB_001a0ac6;
      }
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)pSVar1);
  }
  return;
}

Assistant:

void SectionParserManager::insert(SectionParser* sp, int priority) {
    SectionParserManager::iterator i;
    i = findSectionParser(sp->getSectionName());
    if (i != sectionParsers_.end()) {
      std::cerr << sp->getSectionName() << " section parser already exists"
                << std::endl;
    }

    SectionParserContext context;
    context.priority      = priority;
    context.sectionParser = sp;
    context.lineNo        = 0;
    context.offset        = 0;
    context.isActive      = false;

    if (sectionParsers_.empty()) {
      sectionParsers_.push_back(context);
    } else {
      for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
        if (i->priority == priority) {
          std::cerr << "Priority " << priority << " already used" << std::endl;
          return;
        } else if (i->priority > priority) {
          sectionParsers_.insert(i, context);
          break;
        }
      }
    }
  }